

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifestuff.cpp
# Opt level: O1

int AF_A_HandLower(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  PClass *pPVar5;
  undefined8 uVar6;
  PClass *pPVar7;
  DPSprite *this;
  undefined4 in_register_00000014;
  VMValue *pVVar8;
  char *__assertion;
  bool bVar9;
  double dVar10;
  undefined1 auVar11 [16];
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  uVar6 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005d7785;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    puVar3 = (undefined8 *)(param->field_0).field_1.a;
    pVVar8 = param;
    if (puVar3 != (undefined8 *)0x0) {
      if (puVar3[1] == 0) {
        auVar11 = (**(code **)*puVar3)(puVar3);
        uVar6 = auVar11._8_8_;
        puVar3[1] = auVar11._0_8_;
      }
      pPVar7 = (PClass *)puVar3[1];
      bVar9 = pPVar7 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar9;
      uVar6 = CONCAT71((int7)((ulong)uVar6 >> 8),bVar9);
      pVVar8 = (VMValue *)(ulong)(pPVar7 == pPVar5 || bVar9);
      if (pPVar7 != pPVar5 && !bVar9) {
        do {
          pPVar7 = pPVar7->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
          if (pPVar7 == pPVar5) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005d7785;
      }
    }
    pPVar5 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005d775a;
      puVar4 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar4 != (undefined8 *)0x0) {
        if (puVar4[1] == 0) {
          uVar6 = (**(code **)*puVar4)(puVar4,pVVar8,uVar6,ret);
          puVar4[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar4[1];
        bVar9 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar5 && bVar9) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar9 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar5) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005d7785;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      if ((player_t *)puVar3[0x40] != (player_t *)0x0) {
        this = player_t::GetPSprite((player_t *)puVar3[0x40],PSP_STRIFEHANDS);
        if (this->State == (FState *)0x0) {
          DPSprite::SetState(this,(FState *)0x0,false);
        }
        else {
          dVar10 = this->y + 9.0;
          this->y = dVar10;
          if (256.0 < dVar10) {
            DPSprite::SetState(this,(FState *)0x0,false);
          }
          iVar2 = *(int *)(puVar3[0x40] + 0x138);
          if (0 < iVar2) {
            *(int *)(puVar3[0x40] + 0x138) = iVar2 + -1;
          }
        }
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005d775a:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005d7785:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifestuff.cpp"
                ,0x193,"int AF_A_HandLower(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_HandLower)
{
	PARAM_ACTION_PROLOGUE;

	if (self->player != nullptr)
	{
		DPSprite *psp = self->player->GetPSprite(PSP_STRIFEHANDS);

		if (psp->GetState() == nullptr)
		{
			psp->SetState(nullptr);
			return 0;
		}

		psp->y += 9;
		if (psp->y > WEAPONBOTTOM*2)
		{
			psp->SetState(nullptr);
		}

		if (self->player->extralight > 0) self->player->extralight--;
	}
	return 0;
}